

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa_test.cc
# Opt level: O1

string * __thiscall re2::DeBruijnString_abi_cxx11_(string *__return_storage_ptr__,re2 *this,int n)

{
  byte bVar1;
  int i;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  vector<bool,_std::allocator<bool>_> did;
  allocator_type local_1e1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0;
  vector<bool,_std::allocator<bool>_> local_1d8;
  LogMessage local_1b0;
  
  local_1b0.severity_._0_1_ = 0;
  std::vector<bool,_std::allocator<bool>_>::vector(&local_1d8,0x40000,(bool *)&local_1b0,&local_1e1)
  ;
  uVar2 = 0;
  do {
    bVar1 = (byte)uVar2 & 0x3f;
    local_1d8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p[uVar2 >> 6] =
         local_1d8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] &
         (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x40000);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar3 = 0x11;
  do {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  uVar2 = 0;
  iVar3 = 0x40000;
  local_1e0 = &__return_storage_ptr__->field_2;
  do {
    uVar5 = (int)uVar2 * 2 & 0x3fffe;
    uVar4 = uVar2 >> 2;
    uVar2 = (ulong)(uVar5 + 1);
    if ((*(ulong *)((long)local_1d8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                   (ulong)((uint)uVar4 & 0x7ff8)) >> (uVar2 & 0x3f) & 1) == 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar2 = (ulong)uVar5;
    }
    uVar4 = (ulong)((ulong)((uint)uVar2 & 0x3f) < 0x8000000000000001);
    if ((local_1d8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p[(uVar2 >> 6) + (uVar4 - 1)] >> (uVar2 & 0x3f) & 1)
        != 0) {
      LogMessage::LogMessage
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
                 ,0xa0,3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0.str_,"Check failed: !did[bits]",0x18);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
    }
    local_1d8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p[(uVar2 >> 6) + (uVar4 - 1)] =
         local_1d8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p[(uVar2 >> 6) + (uVar4 - 1)] |
         1L << ((byte)uVar2 & 0x3f);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  if (local_1d8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_1d8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static string DeBruijnString(int n) {
  CHECK_LT(n, static_cast<int>(8*sizeof(int)));
  CHECK_GT(n, 0);

  vector<bool> did(1<<n);
  for (int i = 0; i < 1<<n; i++)
    did[i] = false;

  string s;
  for (int i = 0; i < n-1; i++)
    s.append("0");
  int bits = 0;
  int mask = (1<<n) - 1;
  for (int i = 0; i < (1<<n); i++) {
    bits <<= 1;
    bits &= mask;
    if (!did[bits|1]) {
      bits |= 1;
      s.append("1");
    } else {
      s.append("0");
    }
    CHECK(!did[bits]);
    did[bits] = true;
  }
  return s;
}